

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O0

void __thiscall
soplex::SPxBoundFlippingRT<double>::flipAndUpdate(SPxBoundFlippingRT<double> *this,int *nflips)

{
  double dVar1;
  SPxOut *pSVar2;
  double dVar3;
  bool bVar4;
  Verbosity VVar5;
  Representation RVar6;
  Breakpoint *pBVar7;
  SPxBasisBase<double> *this_00;
  Status *pSVar8;
  double *pdVar9;
  DataKey *pDVar10;
  UpdateVector<double> *pUVar11;
  Item *in_RSI;
  SPxBoundFlippingRT<double> *in_RDI;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  int IdNumber;
  SPxId baseId;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Desc *ds;
  Status stat;
  double objChange;
  double lower;
  double upper;
  double range;
  int idx;
  int i;
  int skipped;
  DataKey *in_stack_fffffffffffffd68;
  int iVar12;
  SPxSolverBase<double> *in_stack_fffffffffffffd70;
  SSVectorBase<double> *in_stack_fffffffffffffd80;
  SSVectorBase<double> *in_stack_fffffffffffffd88;
  SPxSolverBase<double> *in_stack_fffffffffffffd90;
  SVectorBase<double> *in_stack_fffffffffffffdd0;
  SPxSolverBase<double> *in_stack_fffffffffffffdd8;
  SSVectorBase<double> *in_stack_fffffffffffffde0;
  double local_b8;
  undefined4 local_ac;
  Verbosity local_a8;
  undefined1 local_a4 [28];
  DataKey local_88;
  double local_80;
  undefined4 local_78;
  Verbosity local_74;
  double local_70;
  undefined4 local_68;
  Verbosity local_64;
  Desc *local_60;
  Status local_54;
  double local_50;
  DataKey local_48;
  undefined1 local_40 [8];
  double local_38;
  int local_2c;
  int local_28;
  int local_24;
  Item *local_20;
  
  local_20 = in_RSI;
  SSVectorBase<double>::setup(in_stack_fffffffffffffd80);
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2c3069);
  SSVectorBase<double>::reDim
            ((SSVectorBase<double> *)in_stack_fffffffffffffd70,
             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2c309b);
  SSVectorBase<double>::reDim
            ((SSVectorBase<double> *)in_stack_fffffffffffffd70,
             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  SSVectorBase<double>::clear((SSVectorBase<double> *)in_stack_fffffffffffffd70);
  SSVectorBase<double>::clear((SSVectorBase<double> *)in_stack_fffffffffffffd70);
  local_24 = 0;
  for (local_28 = 0; local_28 < *(int *)&(local_20->data).super_SVectorBase<double>.m_elem;
      local_28 = local_28 + 1) {
    pBVar7 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                       ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                        in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    local_2c = pBVar7->idx;
    if (local_2c < 0) {
      local_24 = local_24 + 1;
    }
    else {
      local_50 = 0.0;
      this_00 = SPxSolverBase<double>::basis
                          ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)
      ;
      local_60 = SPxBasisBase<double>::desc(this_00);
      local_38 = 0.0;
      pBVar7 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                         ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                          in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20))
      ;
      iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
      if (pBVar7->src == PVEC) {
        pSVar8 = SPxBasisBase<double>::Desc::status((Desc *)in_stack_fffffffffffffd70,iVar12);
        local_54 = *pSVar8;
        pdVar9 = SPxLPBase<double>::upper
                           (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                            (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        local_40 = (undefined1  [8])*pdVar9;
        pDVar10 = (DataKey *)
                  SPxLPBase<double>::lower
                            (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        local_48 = *pDVar10;
        iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
        if (local_54 == P_ON_LOWER) {
          pSVar8 = SPxBasisBase<double>::Desc::status((Desc *)in_stack_fffffffffffffd70,iVar12);
          *pSVar8 = P_ON_UPPER;
          local_38 = (double)local_40 - (double)local_48;
          iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          dVar1 = *pdVar9;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          *pdVar9 = dVar1;
          pdVar9 = (double *)infinity();
          dVar1 = *pdVar9;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          dVar3 = local_38;
          *pdVar9 = -dVar1;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          local_50 = dVar3 * *pdVar9;
        }
        else if (local_54 == P_ON_UPPER) {
          pSVar8 = SPxBasisBase<double>::Desc::status((Desc *)in_stack_fffffffffffffd70,iVar12);
          *pSVar8 = P_ON_LOWER;
          local_38 = (double)local_48 - (double)local_40;
          iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          dVar1 = *pdVar9;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          *pdVar9 = dVar1;
          pdVar9 = (double *)infinity();
          dVar1 = *pdVar9;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          dVar3 = local_38;
          *pdVar9 = dVar1;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          local_50 = dVar3 * *pdVar9;
        }
        else {
          local_24 = local_24 + 1;
          if ((((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->spxout !=
               (SPxOut *)0x0) &&
             (VVar5 = SPxOut::getVerbosity
                                (((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                 thesolver)->spxout), 0 < (int)VVar5)) {
            local_64 = SPxOut::getVerbosity
                                 (((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                  thesolver)->spxout);
            pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                     spxout;
            local_68 = 1;
            (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_68);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                              );
            SPxSolverBase<double>::pVec
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
            VectorBase<double>::operator[]
                      ((VectorBase<double> *)in_stack_fffffffffffffd70,
                       (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                              );
            pUVar11 = SPxSolverBase<double>::pVec
                                ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                 thesolver);
            UpdateVector<double>::delta(pUVar11);
            SSVectorBase<double>::operator[]
                      ((SSVectorBase<double> *)in_stack_fffffffffffffd70,
                       (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68
                              );
            Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                      ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                       in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,(double)in_stack_fffffffffffffd68
                              );
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                               (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd68);
            pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                     spxout;
            (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_64);
          }
          iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
        }
        SPxSolverBase<double>::pVec
                  ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
        pdVar9 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
        pUVar11 = SPxSolverBase<double>::pVec
                            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                             thesolver);
        UpdateVector<double>::delta(pUVar11);
        local_70 = SSVectorBase<double>::operator[]
                             ((SSVectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
        pBVar7 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            in_stack_fffffffffffffd70,iVar12);
        in_stack_fffffffffffffd80 =
             (SSVectorBase<double> *)
             VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
        in_stack_fffffffffffffd88 =
             (SSVectorBase<double> *)
             VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
        in_stack_fffffffffffffd68 = &local_48;
        in_stack_fffffffffffffd70 = (SPxSolverBase<double> *)local_40;
        SPxOut::
        debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[104],_soplex::SPxBasisBase<double>::Desc::Status_&,_int_&,_double_&,_double,_double_&,_double_&,_double_&,_double_&,_double_&,_0>
                  (in_RDI,(char (*) [104])
                          "PVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} UCbound: {} LCbound: {}\n"
                   ,&local_54,&local_2c,pdVar9,&local_70,(double *)in_stack_fffffffffffffd68,
                   (double *)in_stack_fffffffffffffd70,&pBVar7->val,
                   (double *)in_stack_fffffffffffffd80,(double *)in_stack_fffffffffffffd88);
        SPxSolverBase<double>::vector
                  (in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
        SSVectorBase<double>::multAdd<double,double>
                  (in_stack_fffffffffffffde0,(double)in_stack_fffffffffffffdd8,
                   in_stack_fffffffffffffdd0);
        if ((local_50 != 0.0) || (NAN(local_50))) {
          SPxSolverBase<double>::updateNonbasicValue
                    (in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd88);
        }
      }
      else {
        pBVar7 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                           ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                            in_stack_fffffffffffffd70,iVar12);
        iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
        if (pBVar7->src == COPVEC) {
          pSVar8 = SPxBasisBase<double>::Desc::coStatus((Desc *)in_stack_fffffffffffffd70,iVar12);
          local_54 = *pSVar8;
          pdVar9 = SPxLPBase<double>::rhs
                             (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                              (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
          local_40 = (undefined1  [8])*pdVar9;
          pDVar10 = (DataKey *)
                    SPxLPBase<double>::lhs
                              (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                               (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
          local_48 = *pDVar10;
          iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
          if (local_54 == P_ON_LOWER) {
            pSVar8 = SPxBasisBase<double>::Desc::coStatus((Desc *)in_stack_fffffffffffffd70,iVar12);
            *pSVar8 = P_ON_UPPER;
            local_38 = (double)local_40 - (double)local_48;
            iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            dVar1 = *pdVar9;
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            *pdVar9 = -dVar1;
            pdVar9 = (double *)infinity();
            dVar1 = *pdVar9;
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            dVar3 = local_38;
            *pdVar9 = dVar1;
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            local_50 = dVar3 * *pdVar9;
          }
          else if (local_54 == P_ON_UPPER) {
            pSVar8 = SPxBasisBase<double>::Desc::coStatus((Desc *)in_stack_fffffffffffffd70,iVar12);
            *pSVar8 = P_ON_LOWER;
            local_38 = (double)local_48 - (double)local_40;
            iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            dVar1 = *pdVar9;
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            *pdVar9 = -dVar1;
            pdVar9 = (double *)infinity();
            dVar1 = *pdVar9;
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            dVar3 = local_38;
            *pdVar9 = -dVar1;
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            local_50 = dVar3 * *pdVar9;
          }
          else {
            local_24 = local_24 + 1;
            if ((((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->spxout
                 != (SPxOut *)0x0) &&
               (VVar5 = SPxOut::getVerbosity
                                  (((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                   thesolver)->spxout), 0 < (int)VVar5)) {
              local_74 = SPxOut::getVerbosity
                                   (((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                    thesolver)->spxout);
              pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                       spxout;
              local_78 = 1;
              (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_78);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (char *)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (char *)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (char *)in_stack_fffffffffffffd68);
              SPxSolverBase<double>::coPvec
                        ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
              VectorBase<double>::operator[]
                        ((VectorBase<double> *)in_stack_fffffffffffffd70,
                         (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (double)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (char *)in_stack_fffffffffffffd68);
              pUVar11 = SPxSolverBase<double>::coPvec
                                  ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                   thesolver);
              UpdateVector<double>::delta(pUVar11);
              SSVectorBase<double>::operator[]
                        ((SSVectorBase<double> *)in_stack_fffffffffffffd70,
                         (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (double)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (char *)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (double)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (char *)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (double)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (char *)in_stack_fffffffffffffd68);
              Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                        ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                         in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (double)in_stack_fffffffffffffd68);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd68);
              pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                       spxout;
              (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_74);
            }
            iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
          }
          SPxSolverBase<double>::coPvec
                    ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          pUVar11 = SPxSolverBase<double>::coPvec
                              ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                               thesolver);
          UpdateVector<double>::delta(pUVar11);
          local_80 = SSVectorBase<double>::operator[]
                               ((SSVectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          pBVar7 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                             ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                              in_stack_fffffffffffffd70,iVar12);
          in_stack_fffffffffffffd80 =
               (SSVectorBase<double> *)
               VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          in_stack_fffffffffffffd88 =
               (SSVectorBase<double> *)
               VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
          in_stack_fffffffffffffd68 = &local_48;
          in_stack_fffffffffffffd70 = (SPxSolverBase<double> *)local_40;
          SPxOut::
          debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[106],_soplex::SPxBasisBase<double>::Desc::Status_&,_int_&,_double_&,_double,_double_&,_double_&,_double_&,_double_&,_double_&,_0>
                    (in_RDI,(char (*) [106])
                            "COPVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} URbound: {} LRbound: {}\n"
                     ,&local_54,&local_2c,pdVar9,&local_80,(double *)in_stack_fffffffffffffd68,
                     (double *)in_stack_fffffffffffffd70,&pBVar7->val,
                     (double *)in_stack_fffffffffffffd80,(double *)in_stack_fffffffffffffd88);
          SSVectorBase<double>::operator[]
                    ((SSVectorBase<double> *)in_stack_fffffffffffffd70,
                     (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
          SSVectorBase<double>::setValue
                    ((SSVectorBase<double> *)in_stack_fffffffffffffd90,
                     (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                     (double)in_stack_fffffffffffffd80);
          if ((local_50 != 0.0) || (NAN(local_50))) {
            SPxSolverBase<double>::updateNonbasicValue
                      (in_stack_fffffffffffffd90,(double)in_stack_fffffffffffffd88);
          }
        }
        else {
          pBVar7 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                             ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                              in_stack_fffffffffffffd70,iVar12);
          if (pBVar7->src == FVEC) {
            SPxSolverBase<double>::basis
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
            pDVar10 = &SPxBasisBase<double>::baseId
                                 ((SPxBasisBase<double> *)in_stack_fffffffffffffd70,
                                  (int)((ulong)in_stack_fffffffffffffd68 >> 0x20))->super_DataKey;
            local_88 = *pDVar10;
            bVar4 = SPxId::isSPxRowId((SPxId *)&local_88);
            if (bVar4) {
              SPxRowId::SPxRowId((SPxRowId *)(local_a4 + 0x10),(SPxId *)&local_88);
              local_a4._24_4_ =
                   SPxLPBase<double>::number
                             (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                              (SPxRowId *)in_stack_fffffffffffffd68);
              pSVar8 = SPxBasisBase<double>::Desc::rowStatus
                                 ((Desc *)in_stack_fffffffffffffd70,
                                  (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              local_54 = *pSVar8;
              pdVar9 = SPxLPBase<double>::rhs
                                 (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                                  (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              local_40 = (undefined1  [8])*pdVar9;
              pDVar10 = (DataKey *)
                        SPxLPBase<double>::lhs
                                  (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                                   (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              local_48 = *pDVar10;
              iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
              if (local_54 == P_ON_LOWER) {
                pSVar8 = SPxBasisBase<double>::Desc::rowStatus
                                   ((Desc *)in_stack_fffffffffffffd70,iVar12);
                *pSVar8 = P_ON_UPPER;
                local_38 = (double)local_48 - (double)local_40;
                iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                dVar1 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = -dVar1;
                pdVar9 = (double *)infinity();
                dVar1 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = dVar1;
              }
              else if (local_54 == P_ON_UPPER) {
                pSVar8 = SPxBasisBase<double>::Desc::rowStatus
                                   ((Desc *)in_stack_fffffffffffffd70,iVar12);
                *pSVar8 = P_ON_LOWER;
                local_38 = (double)local_40 - (double)local_48;
                iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                dVar1 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = -dVar1;
                pdVar9 = (double *)infinity();
                dVar1 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = -dVar1;
              }
              else {
                local_24 = local_24 + 1;
                if ((((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                     spxout != (SPxOut *)0x0) &&
                   (VVar5 = SPxOut::getVerbosity
                                      (((in_RDI->super_SPxFastRT<double>).
                                        super_SPxRatioTester<double>.thesolver)->spxout),
                   0 < (int)VVar5)) {
                  local_a4._12_4_ =
                       SPxOut::getVerbosity
                                 (((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                  thesolver)->spxout);
                  pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           )->spxout;
                  local_a4._8_4_ = 1;
                  (*pSVar2->_vptr_SPxOut[2])(pSVar2,local_a4 + 8);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  SPxSolverBase<double>::fVec
                            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                             thesolver);
                  VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  pUVar11 = SPxSolverBase<double>::fVec
                                      ((in_RDI->super_SPxFastRT<double>).
                                       super_SPxRatioTester<double>.thesolver);
                  UpdateVector<double>::delta(pUVar11);
                  SSVectorBase<double>::operator[]
                            ((SSVectorBase<double> *)in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                            ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                             in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd68);
                  pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           )->spxout;
                  (*pSVar2->_vptr_SPxOut[2])(pSVar2,local_a4 + 0xc);
                }
                iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
              }
            }
            else {
              in_stack_fffffffffffffdd8 =
                   (in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
              in_stack_fffffffffffffde0 = (SSVectorBase<double> *)local_a4;
              SPxColId::SPxColId((SPxColId *)in_stack_fffffffffffffde0,(SPxId *)&local_88);
              local_a4._24_4_ =
                   SPxLPBase<double>::number
                             (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                              (SPxColId *)in_stack_fffffffffffffd68);
              pSVar8 = SPxBasisBase<double>::Desc::colStatus
                                 ((Desc *)in_stack_fffffffffffffd70,
                                  (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              local_54 = *pSVar8;
              pdVar9 = SPxLPBase<double>::upper
                                 (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                                  (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              local_40 = (undefined1  [8])*pdVar9;
              pDVar10 = (DataKey *)
                        SPxLPBase<double>::lower
                                  (&in_stack_fffffffffffffd70->super_SPxLPBase<double>,
                                   (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
              local_48 = *pDVar10;
              iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
              if (local_54 == P_ON_LOWER) {
                pSVar8 = SPxBasisBase<double>::Desc::colStatus
                                   ((Desc *)in_stack_fffffffffffffd70,iVar12);
                *pSVar8 = P_ON_UPPER;
                local_38 = (double)local_48 - (double)local_40;
                iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                dVar1 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = -dVar1;
                pdVar9 = (double *)infinity();
                dVar1 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = dVar1;
              }
              else if (local_54 == P_ON_UPPER) {
                pSVar8 = SPxBasisBase<double>::Desc::colStatus
                                   ((Desc *)in_stack_fffffffffffffd70,iVar12);
                *pSVar8 = P_ON_LOWER;
                local_38 = (double)local_40 - (double)local_48;
                iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                dVar1 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = -dVar1;
                pdVar9 = (double *)infinity();
                in_stack_fffffffffffffdd0 =
                     (SVectorBase<double> *)((ulong)*pdVar9 ^ 0x8000000000000000);
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
                *pdVar9 = (double)in_stack_fffffffffffffdd0;
              }
              else {
                local_24 = local_24 + 1;
                if ((((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->
                     spxout != (SPxOut *)0x0) &&
                   (VVar5 = SPxOut::getVerbosity
                                      (((in_RDI->super_SPxFastRT<double>).
                                        super_SPxRatioTester<double>.thesolver)->spxout),
                   0 < (int)VVar5)) {
                  local_a8 = SPxOut::getVerbosity
                                       (((in_RDI->super_SPxFastRT<double>).
                                         super_SPxRatioTester<double>.thesolver)->spxout);
                  pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           )->spxout;
                  local_ac = 1;
                  (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_ac);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  SPxSolverBase<double>::fVec
                            ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                             thesolver);
                  VectorBase<double>::operator[]
                            ((VectorBase<double> *)in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  pUVar11 = SPxSolverBase<double>::fVec
                                      ((in_RDI->super_SPxFastRT<double>).
                                       super_SPxRatioTester<double>.thesolver);
                  UpdateVector<double>::delta(pUVar11);
                  SSVectorBase<double>::operator[]
                            ((SSVectorBase<double> *)in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (char *)in_stack_fffffffffffffd68);
                  Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                            ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                             in_stack_fffffffffffffd70,
                             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (double)in_stack_fffffffffffffd68);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffd70,
                                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffd68);
                  pSVar2 = ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver
                           )->spxout;
                  (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_a8);
                }
                iVar12 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
              }
            }
            SPxSolverBase<double>::fVec
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
            pdVar9 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            pUVar11 = SPxSolverBase<double>::fVec
                                ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.
                                 thesolver);
            UpdateVector<double>::delta(pUVar11);
            local_b8 = SSVectorBase<double>::operator[]
                                 ((SSVectorBase<double> *)in_stack_fffffffffffffd70,iVar12);
            pBVar7 = Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::operator[]
                               ((Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *)
                                in_stack_fffffffffffffd70,iVar12);
            in_stack_fffffffffffffd68 = &local_48;
            in_stack_fffffffffffffd70 = (SPxSolverBase<double> *)local_40;
            SPxOut::
            debug<soplex::SPxBoundFlippingRT<double>,_const_char_(&)[90],_soplex::SPxBasisBase<double>::Desc::Status_&,_int_&,_double_&,_double,_double_&,_double_&,_double_&,_0>
                      (in_RDI,(char (*) [90])
                              "basic row/col flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} \n"
                       ,&local_54,&local_2c,pdVar9,&local_b8,(double *)in_stack_fffffffffffffd68,
                       (double *)in_stack_fffffffffffffd70,&pBVar7->val);
            SSVectorBase<double>::add
                      (in_stack_fffffffffffffd80,(int)((ulong)pBVar7 >> 0x20),
                       (double)in_stack_fffffffffffffd70);
          }
        }
      }
    }
  }
  *(int *)&(local_20->data).super_SVectorBase<double>.m_elem =
       *(int *)&(local_20->data).super_SVectorBase<double>.m_elem - local_24;
  if (0 < *(int *)&(local_20->data).super_SVectorBase<double>.m_elem) {
    RVar6 = SPxSolverBase<double>::rep
                      ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver);
    if (RVar6 == ROW) {
      VectorBase<double>::operator-=
                ((VectorBase<double> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      SPxSolverBase<double>::setup4coSolve2
                ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver,
                 &in_RDI->updPrimVec,&in_RDI->updPrimRhs);
    }
    else {
      VectorBase<double>::operator-=
                ((VectorBase<double> *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      SPxSolverBase<double>::setup4solve2
                ((in_RDI->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver,
                 &in_RDI->updPrimVec,&in_RDI->updPrimRhs);
    }
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::flipAndUpdate(
   int&                  nflips              /**< number of bounds that should be flipped */
)
{
   assert(nflips > 0);

   // number of bound flips that are not performed
   int skipped;

   updPrimRhs.setup();
   updPrimRhs.reDim(this->thesolver->dim());
   updPrimVec.reDim(this->thesolver->dim());
   updPrimRhs.clear();
   updPrimVec.clear();

   skipped = 0;

   for(int i = 0; i < nflips; ++i)
   {
      int idx;
      idx = breakpoints[i].idx;

      if(idx < 0)
      {
         ++skipped;
         continue;
      }

      R range;
      R upper;
      R lower;
      R objChange = 0.0;
      typename SPxBasisBase<R>::Desc::Status stat;
      typename SPxBasisBase<R>::Desc& ds = this->thesolver->basis().desc();

      range = 0;

      if(breakpoints[i].src == PVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.status(idx);
         upper = this->thesolver->upper(idx);
         lower = this->thesolver->lower(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theLbound)[idx] == R(-infinity));
            (*this->thesolver->theLbound)[idx] = (*this->thesolver->theUbound)[idx];
            (*this->thesolver->theUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theLbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.status(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theUbound)[idx] == R(infinity));
            (*this->thesolver->theUbound)[idx] = (*this->thesolver->theLbound)[idx];
            (*this->thesolver->theLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theUbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "PVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->pVec()[idx]
                            << " upd: " << this->thesolver->pVec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "PVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} UCbound: {} LCbound: {}\n",
                       stat, idx, this->thesolver->pVec()[idx], this->thesolver->pVec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theUCbound[idx], this->thesolver->theLCbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.multAdd(range, this->thesolver->vector(idx));

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == COPVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         stat = ds.coStatus(idx);
         upper = this->thesolver->rhs(idx);
         lower = this->thesolver->lhs(idx);

         switch(stat)
         {
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            range = lower - upper;
            assert((*this->thesolver->theCoUbound)[idx] == R(infinity));
            (*this->thesolver->theCoUbound)[idx] = -(*this->thesolver->theCoLbound)[idx];
            (*this->thesolver->theCoLbound)[idx] = R(-infinity);
            objChange = range * (*this->thesolver->theCoUbound)[idx];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            ds.coStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            range = upper - lower;
            assert((*this->thesolver->theCoLbound)[idx] == R(-infinity));
            (*this->thesolver->theCoLbound)[idx] = -(*this->thesolver->theCoUbound)[idx];
            (*this->thesolver->theCoUbound)[idx] = R(infinity);
            objChange = range * (*this->thesolver->theCoLbound)[idx];
            break;

         default :
            ++skipped;
            SPX_MSG_WARNING((*this->thesolver->spxout),
                            (*this->thesolver->spxout) << "COPVEC unexpected status: " << static_cast<int>(stat)
                            << " index: " << idx
                            << " val: " << this->thesolver->coPvec()[idx]
                            << " upd: " << this->thesolver->coPvec().delta()[idx]
                            << " lower: " << lower
                            << " upper: " << upper
                            << " bp.val: " << breakpoints[i].val
                            << std::endl;)
         }

         SPxOut::debug(this,
                       "COPVEC flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} URbound: {} LRbound: {}\n",
                       stat, idx, this->thesolver->coPvec()[idx], this->thesolver->coPvec().delta()[idx], lower, upper,
                       breakpoints[i].val, this->thesolver->theURbound[idx], this->thesolver->theLRbound[idx]);
         assert(spxAbs(range) < 1e20);
         updPrimRhs.setValue(idx, updPrimRhs[idx] - range);

         if(objChange != 0.0)
            this->thesolver->updateNonbasicValue(objChange);
      }
      else if(breakpoints[i].src == FVEC)
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);
         SPxId baseId = this->thesolver->basis().baseId(idx);
         int IdNumber;

         if(baseId.isSPxRowId())
         {
            IdNumber = this->thesolver->number(SPxRowId(baseId));
            stat = ds.rowStatus(IdNumber);
            upper = this->thesolver->rhs(IdNumber);
            lower = this->thesolver->lhs(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.rowStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "unexpected basis status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }
         else
         {
            assert(baseId.isSPxColId());
            IdNumber = this->thesolver->number(SPxColId(baseId));
            stat = ds.colStatus(IdNumber);
            upper = this->thesolver->upper(IdNumber);
            lower = this->thesolver->lower(IdNumber);

            switch(stat)
            {
            case SPxBasisBase<R>::Desc::P_ON_UPPER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               range = upper - lower;
               assert(this->thesolver->theUBbound[idx] == R(infinity));
               this->thesolver->theUBbound[idx] = -this->thesolver->theLBbound[idx];
               this->thesolver->theLBbound[idx] = R(-infinity);
               break;

            case SPxBasisBase<R>::Desc::P_ON_LOWER :
               ds.colStatus(IdNumber) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               range = lower - upper;
               assert(this->thesolver->theLBbound[idx] == R(-infinity));
               this->thesolver->theLBbound[idx] = -this->thesolver->theUBbound[idx];
               this->thesolver->theUBbound[idx] = R(infinity);
               break;

            default :
               ++skipped;
               SPX_MSG_WARNING((*this->thesolver->spxout),
                               (*this->thesolver->spxout) << "FVEC unexpected status: " << static_cast<int>(stat)
                               << " index: " << idx
                               << " val: " << this->thesolver->fVec()[idx]
                               << " upd: " << this->thesolver->fVec().delta()[idx]
                               << " lower: " << lower
                               << " upper: " << upper
                               << " bp.val: " << breakpoints[i].val
                               << std::endl;)
            }
         }

         SPxOut::debug(this,
                       "basic row/col flipped from: {} index: {} val: {} upd: {} lower: {} upper: {} bp.val: {} \n",
                       stat, idx, this->thesolver->fVec()[idx], this->thesolver->fVec().delta()[idx], lower, upper,
                       breakpoints[i].val);
         assert(spxAbs(range) < 1e20);
         assert(updPrimRhs[idx] == 0);
         updPrimRhs.add(idx, range);
      }
   }

   nflips -= skipped;

   if(nflips > 0)
   {
      if(this->thesolver->rep() == SPxSolverBase<R>::ROW)
      {
         assert(this->m_type == SPxSolverBase<R>::ENTER);
         (*this->thesolver->theCoPrhs) -= updPrimRhs;
         this->thesolver->setup4coSolve2(&updPrimVec, &updPrimRhs);
      }
      else
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
         assert(this->m_type == SPxSolverBase<R>::LEAVE);
         (*this->thesolver->theFrhs) -= updPrimRhs;
         this->thesolver->setup4solve2(&updPrimVec, &updPrimRhs);
      }
   }

   return;
}